

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_non_base_row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
               (Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
                *m)

{
  pointer pvVar1;
  uint rowIndex;
  pointer witness;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_98;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_78;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  
  local_98.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  build_simple_reduced_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>>
            ();
  local_98.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  rowIndex = 0;
  local_48 = (_Base_ptr)0x0;
  local_78.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_58);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_78);
  pvVar1 = local_98.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    witness = local_98.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_ordered_row<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
                ((column_content<typename_Matrix<RU_rep_options_with_row_access<false,_(Column_types)7,_false,_true,_true,_true,_true,_true>_>::Column>
                  *)local_58,m,rowIndex);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>_>
                          *)local_58);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_58);
      witness = witness + 1;
      rowIndex = rowIndex + 1;
    } while (witness != pvVar1);
  }
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void test_non_base_row_access(Matrix& m) {
  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    if constexpr (is_RU<Matrix>()) {
      rows = build_simple_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_simple_row_matrix<typename Matrix::Column>();
    }
  } else {
    rows = build_simple_chain_row_matrix<typename Matrix::Column>();
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}